

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O2

void aes_sdctr_sw(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipheralg *psVar1;
  ssh_cipher *psVar2;
  void *vp;
  ssh_cipher *psVar3;
  ssh_cipheralg *psVar4;
  ssh_cipheralg *psVar5;
  ssh_cipheralg *psVar6;
  ssh_cipheralg *psVar7;
  ssh_cipheralg *psVar8;
  ssh_cipheralg *psVar9;
  ssh_cipheralg *psVar10;
  undefined1 *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ssh_cipheralg *psVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  void *pvVar51;
  ulong uVar52;
  ulong uVar53;
  ulong local_f8;
  ulong local_f0;
  ulong local_d0;
  ssh_cipher *local_80;
  uint8_t *p;
  
  pvVar51 = (void *)((long)blklen + (long)vblk);
  psVar1 = (ssh_cipheralg *)(ciph + -9);
  psVar2 = ciph + -1;
  for (; vblk < pvVar51; vblk = (void *)((long)vblk + 0x10)) {
    psVar25 = psVar2->vt;
    if (psVar2->vt == (ssh_cipheralg *)psVar2) {
      puVar11 = (undefined1 *)((long)&ciph[-8].vt + 7);
      for (lVar16 = -0x48; lVar16 < -8; lVar16 = lVar16 + 0x10) {
        puVar21 = puVar11;
        for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
          psVar25 = ciph[lVar26 + -0xb].vt;
          ((ssh_cipher *)(puVar21 + -7))->vt =
               (ssh_cipheralg *)
               ((ulong)psVar25 >> 0x38 | ((ulong)psVar25 & 0xff000000000000) >> 0x28 |
                ((ulong)psVar25 & 0xff0000000000) >> 0x18 | ((ulong)psVar25 & 0xff00000000) >> 8 |
                ((ulong)psVar25 & 0xff000000) << 8 | ((ulong)psVar25 & 0xff0000) << 0x18 |
                ((ulong)psVar25 & 0xff00) << 0x28 | (long)psVar25 << 0x38);
          puVar21 = puVar21 + -8;
        }
        uVar12 = 1;
        for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
          psVar3 = ciph + lVar26 + -0xb;
          psVar25 = psVar3->vt;
          psVar3->vt = (ssh_cipheralg *)((long)&psVar3->vt->new + uVar12);
          uVar12 = (ulong)CARRY8((ulong)psVar25,uVar12);
        }
        puVar11 = puVar11 + 0x10;
      }
      psVar25 = ciph[-9].vt;
      psVar4 = ciph[-8].vt;
      uVar22 = (((ulong)psVar25 >> 7 ^ (ulong)psVar25) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar25;
      uVar12 = (((ulong)psVar4 >> 7 ^ (ulong)psVar4) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar4;
      uVar22 = ((uVar22 >> 0xe ^ uVar22) & 0xcccc0000cccc) * 0x4001 ^ uVar22;
      uVar12 = ((uVar12 >> 0xe ^ uVar12) & 0xcccc0000cccc) * 0x4001 ^ uVar12;
      uVar22 = (ulong)(((uint)(uVar22 >> 0x1c) ^ (uint)uVar22) & 0xf0f0f0f0) * 0x10000001 ^ uVar22;
      uVar12 = (ulong)(((uint)(uVar12 >> 0x1c) ^ (uint)uVar12) & 0xf0f0f0f0) * 0x10000001 ^ uVar12;
      uVar34 = (uVar22 >> 8 ^ uVar12) & 0xff00ff00ff00ff;
      uVar22 = uVar34 << 8 ^ uVar22;
      uVar34 = uVar34 ^ uVar12;
      local_d0 = uVar22 & 0xffff;
      uVar41 = uVar22 >> 0x10 & 0xffff;
      uVar38 = uVar22 >> 0x20 & 0xffff;
      uVar22 = uVar22 >> 0x30;
      uVar12 = uVar34 & 0xffff;
      local_f8 = uVar34 >> 0x10 & 0xffff;
      local_f0 = uVar34 >> 0x20 & 0xffff;
      uVar34 = uVar34 >> 0x30;
      for (lVar16 = 0x10; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
        uVar27 = *(ulong *)((long)&ciph[-9].vt + lVar16);
        uVar13 = *(ulong *)((long)&ciph[-8].vt + lVar16);
        uVar27 = ((uVar27 >> 7 ^ uVar27) & 0xaa00aa00aa00aa) * 0x81 ^ uVar27;
        uVar13 = ((uVar13 >> 7 ^ uVar13) & 0xaa00aa00aa00aa) * 0x81 ^ uVar13;
        uVar27 = ((uVar27 >> 0xe ^ uVar27) & 0xcccc0000cccc) * 0x4001 ^ uVar27;
        uVar13 = ((uVar13 >> 0xe ^ uVar13) & 0xcccc0000cccc) * 0x4001 ^ uVar13;
        uVar27 = (ulong)(((uint)(uVar27 >> 0x1c) ^ (uint)uVar27) & 0xf0f0f0f0) * 0x10000001 ^ uVar27
        ;
        uVar13 = (ulong)(((uint)(uVar13 >> 0x1c) ^ (uint)uVar13) & 0xf0f0f0f0) * 0x10000001 ^ uVar13
        ;
        uVar14 = (uVar27 >> 8 ^ uVar13) & 0xff00ff00ff00ff;
        uVar27 = uVar14 << 8 ^ uVar27;
        bVar15 = (byte)lVar16;
        uVar14 = uVar14 ^ uVar13;
        local_d0 = local_d0 | (uVar27 & 0xffff) << (bVar15 & 0x3f);
        uVar41 = uVar41 | (uVar27 >> 0x10 & 0xffff) << (bVar15 & 0x3f);
        uVar38 = uVar38 | (uVar27 >> 0x20 & 0xffff) << (bVar15 & 0x3f);
        uVar22 = uVar22 | (uVar27 >> 0x30) << (bVar15 & 0x3f);
        uVar12 = uVar12 | (uVar14 & 0xffff) << (bVar15 & 0x3f);
        local_f8 = local_f8 | (uVar14 >> 0x10 & 0xffff) << (bVar15 & 0x3f);
        local_f0 = local_f0 | (uVar14 >> 0x20 & 0xffff) << (bVar15 & 0x3f);
        uVar34 = uVar34 | (uVar14 >> 0x30) << (bVar15 & 0x3f);
      }
      local_d0 = local_d0 ^ (ulong)ciph[-0xa2].vt;
      uVar12 = uVar12 ^ (ulong)ciph[-0xa1].vt;
      uVar41 = uVar41 ^ (ulong)ciph[-0xa0].vt;
      local_f8 = local_f8 ^ (ulong)ciph[-0x9f].vt;
      uVar38 = uVar38 ^ (ulong)ciph[-0x9e].vt;
      local_f0 = local_f0 ^ (ulong)ciph[-0x9d].vt;
      uVar22 = uVar22 ^ (ulong)ciph[-0x9c].vt;
      uVar34 = uVar34 ^ (ulong)ciph[-0x9b].vt;
      uVar13 = (ulong)(*(int *)&ciph[-0xc].vt - 1);
      local_80 = ciph + -0x9a;
      for (uVar27 = uVar13; (int)uVar27 != 0; uVar27 = (ulong)((int)uVar27 - 1)) {
        uVar14 = uVar41 ^ uVar38;
        uVar17 = uVar12 ^ uVar34;
        uVar18 = uVar41 ^ uVar34;
        local_f0 = local_f0 ^ uVar22;
        uVar47 = local_d0 ^ local_f0;
        uVar39 = uVar38 ^ uVar34;
        uVar19 = uVar17 ^ uVar14;
        uVar41 = uVar41 ^ local_f8 ^ uVar19;
        uVar22 = local_f8 ^ uVar19 ^ uVar22;
        uVar32 = uVar41 ^ local_f0;
        uVar45 = uVar22 ^ uVar39;
        uVar23 = (uVar32 ^ uVar45) & uVar14 ^ uVar45 & uVar39;
        uVar20 = uVar32 & uVar18 ^ uVar45 & uVar39;
        uVar12 = uVar12 ^ uVar47;
        local_f0 = local_f0 ^ uVar45;
        uVar28 = uVar22 ^ uVar41 & uVar19 ^ (uVar41 ^ local_d0) & (uVar12 ^ uVar18) ^ uVar23;
        uVar23 = uVar12 & uVar47 ^ local_f0 ^ local_f0 & uVar17 ^ uVar17 ^ uVar23;
        uVar42 = (uVar47 ^ uVar38) & local_d0 ^ uVar18 ^ uVar32 ^ uVar41 & uVar19 ^ uVar20;
        uVar20 = local_f0 & uVar17 ^ uVar34 ^ (uVar45 ^ local_d0) & (uVar47 ^ uVar34) ^ local_f0 ^
                 uVar20;
        uVar22 = uVar23 & uVar28;
        uVar28 = uVar28 ^ uVar42;
        uVar24 = (uVar20 ^ uVar22) & uVar28 ^ uVar42;
        uVar42 = (uVar42 ^ uVar22) & (uVar20 ^ uVar23);
        uVar35 = uVar42 ^ uVar20;
        uVar42 = (uVar42 ^ uVar22) & uVar20;
        uVar23 = uVar23 ^ uVar42;
        uVar28 = (uVar42 ^ uVar20 ^ uVar22) & uVar24 ^ uVar28;
        uVar29 = uVar23 ^ uVar35;
        uVar42 = uVar28 ^ uVar29;
        uVar30 = uVar29 & (uVar12 ^ uVar18);
        uVar20 = uVar24 ^ uVar35;
        local_f0 = local_f0 & (uVar28 ^ uVar24);
        uVar17 = (uVar28 ^ uVar24) & uVar17;
        uVar48 = (uVar45 ^ local_d0) & uVar24;
        uVar22 = (uVar32 ^ uVar45) & (uVar42 ^ uVar20);
        uVar14 = (uVar42 ^ uVar20) & uVar14;
        uVar43 = uVar28 & uVar12 ^ uVar48;
        uVar52 = uVar41 & uVar23 ^ local_f0;
        uVar12 = uVar17 ^ local_d0 & uVar35 ^ uVar52;
        uVar31 = uVar20 & uVar39 ^ uVar14;
        uVar50 = uVar12 ^ uVar43 ^ uVar31;
        uVar31 = uVar31 ^ uVar47 & uVar28;
        uVar39 = uVar45 & uVar20 ^ local_f0 ^ uVar22;
        uVar45 = uVar32 & uVar42 ^ uVar22 ^ uVar31;
        uVar31 = uVar31 ^ uVar30 ^ uVar23 & uVar19;
        uVar22 = uVar47 & uVar28 ^ uVar39;
        uVar20 = uVar24 & (uVar47 ^ uVar34) ^ uVar12 ^ uVar45;
        uVar12 = (uVar41 ^ local_d0) & uVar29 ^ uVar31;
        uVar31 = uVar31 ^ uVar39;
        uVar45 = uVar45 ^ uVar17 ^ uVar43;
        uVar52 = uVar52 ^ uVar12;
        uVar12 = uVar12 ^ uVar48 ^ local_d0 & uVar35;
        uVar36 = uVar35 & (uVar47 ^ uVar38) ^ uVar30 ^ uVar20;
        uVar47 = uVar52 ^ uVar22;
        uVar20 = uVar42 & uVar18 ^ uVar14 ^ uVar22 ^ uVar20;
        uVar48 = ((uVar50 >> 8 ^ uVar50) & 0xcc00cc00cc00cc) * 0x101 ^ uVar50;
        uVar22 = uVar48 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar23 = (uVar48 & 0xa000a000a000a) << 0xc;
        uVar30 = ((uVar45 >> 8 ^ uVar45) & 0xcc00cc00cc00cc) * 0x101 ^ uVar45;
        uVar41 = uVar30 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar24 = (uVar30 & 0xa000a000a000a) << 0xc;
        uVar40 = ((uVar36 >> 8 ^ uVar36) & 0xcc00cc00cc00cc) * 0x101 ^ uVar36;
        uVar34 = uVar40 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar42 = (uVar40 & 0xa000a000a000a) << 0xc;
        uVar44 = ((uVar12 >> 8 ^ uVar12) & 0xcc00cc00cc00cc) * 0x101 ^ uVar12;
        uVar38 = uVar44 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar28 = (uVar44 & 0xa000a000a000a) << 0xc;
        uVar29 = ((uVar52 >> 8 ^ uVar52) & 0xcc00cc00cc00cc) * 0x101 ^ uVar52;
        uVar14 = uVar29 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar32 = (uVar29 & 0xa000a000a000a) << 0xc;
        uVar33 = ((uVar20 >> 8 ^ uVar20) & 0xcc00cc00cc00cc) * 0x101 ^ uVar20;
        uVar17 = (uVar33 & 0xa000a000a000a) << 0xc;
        uVar35 = uVar33 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar46 = ((uVar47 >> 8 ^ uVar47) & 0xcc00cc00cc00cc) * 0x101 ^ uVar47;
        uVar18 = (uVar46 & 0xa000a000a000a) << 0xc;
        uVar39 = uVar46 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar53 = ((uVar31 >> 8 ^ uVar31) & 0xcc00cc00cc00cc) * 0x101 ^ uVar31;
        uVar19 = (uVar53 & 0xa000a000a000a) << 0xc;
        uVar43 = uVar53 >> 4 & 0xaaa0aaa0aaa0aaa;
        uVar50 = (uVar48 & 0x4444444444444444 | uVar23 | uVar22) >> 1 |
                 (uVar50 & 0x1111111111111111) << 3;
        uVar49 = (uVar30 & 0x4444444444444444 | uVar24 | uVar41) >> 1 |
                 (uVar45 & 0x1111111111111111) << 3;
        uVar36 = (uVar40 & 0x4444444444444444 | uVar42 | uVar34) >> 1 |
                 (uVar36 & 0x1111111111111111) << 3;
        uVar37 = (uVar44 & 0x4444444444444444 | uVar28 | uVar38) >> 1 |
                 (uVar12 & 0x1111111111111111) << 3;
        uVar45 = (uVar29 & 0x4444444444444444 | uVar32 | uVar14) >> 1 |
                 (uVar52 & 0x1111111111111111) << 3;
        uVar52 = (uVar33 & 0x4444444444444444 | uVar17 | uVar35) >> 1 |
                 (uVar20 & 0x1111111111111111) << 3;
        uVar47 = (uVar46 & 0x4444444444444444 | uVar18 | uVar39) >> 1 |
                 (uVar47 & 0x1111111111111111) << 3;
        uVar20 = (uVar53 & 0x4444444444444444 | uVar19 | uVar43) >> 1 |
                 (uVar31 & 0x1111111111111111) << 3;
        uVar12 = (uVar48 & 0x5555555555555555 | uVar23 | uVar22) ^ uVar50;
        uVar41 = (uVar30 & 0x5555555555555555 | uVar24 | uVar41) ^ uVar49;
        uVar23 = (uVar40 & 0x5555555555555555 | uVar42 | uVar34) ^ uVar36;
        uVar38 = (uVar44 & 0x5555555555555555 | uVar28 | uVar38) ^ uVar37;
        uVar19 = (uVar53 & 0x5555555555555555 | uVar19 | uVar43) ^ uVar20;
        uVar22 = (uVar29 & 0x5555555555555555 | uVar32 | uVar14) ^ uVar45;
        uVar34 = (uVar33 & 0x5555555555555555 | uVar17 | uVar35) ^ uVar52;
        uVar14 = (uVar46 & 0x5555555555555555 | uVar18 | uVar39) ^ uVar47;
        local_d0 = uVar50 ^ uVar19 ^
                   (uVar12 >> 2 & 0x3333333333333333 | uVar12 * 4 & 0xcccccccccccccccc) ^
                   (ulong)local_80->vt;
        uVar12 = uVar49 ^ uVar12 ^ uVar19 ^
                 (uVar41 >> 2 & 0x3333333333333333 | uVar41 * 4 & 0xcccccccccccccccc) ^
                 (ulong)local_80[1].vt;
        uVar41 = uVar36 ^ uVar41 ^
                 (uVar23 >> 2 & 0x3333333333333333 | uVar23 * 4 & 0xcccccccccccccccc) ^
                 (ulong)local_80[2].vt;
        local_f8 = uVar37 ^ uVar19 ^ uVar23 ^
                   (uVar38 >> 2 & 0x3333333333333333 | uVar38 * 4 & 0xcccccccccccccccc) ^
                   (ulong)local_80[3].vt;
        uVar38 = uVar19 ^ uVar45 ^ uVar38 ^
                 (uVar22 >> 2 & 0x3333333333333333 | uVar22 * 4 & 0xcccccccccccccccc) ^
                 (ulong)local_80[4].vt;
        local_f0 = uVar52 ^ uVar22 ^
                   (uVar34 >> 2 & 0x3333333333333333 | uVar34 * 4 & 0xcccccccccccccccc) ^
                   (ulong)local_80[5].vt;
        uVar22 = uVar47 ^ uVar34 ^
                 (uVar14 >> 2 & 0x3333333333333333 | uVar14 * 4 & 0xcccccccccccccccc) ^
                 (ulong)local_80[6].vt;
        uVar34 = uVar20 ^ uVar14 ^
                 (uVar19 >> 2 & 0x3333333333333333 | uVar19 * 4 & 0xcccccccccccccccc) ^
                 (ulong)local_80[7].vt;
        local_80 = local_80 + 8;
      }
      uVar27 = uVar41 ^ uVar38;
      uVar14 = uVar12 ^ uVar34;
      uVar17 = uVar41 ^ uVar34;
      local_f0 = local_f0 ^ uVar22;
      uVar18 = local_d0 ^ local_f0;
      uVar19 = uVar14 ^ uVar27;
      uVar41 = uVar41 ^ local_f8 ^ uVar19;
      uVar22 = local_f8 ^ uVar19 ^ uVar22;
      uVar35 = uVar38 ^ uVar34;
      uVar23 = uVar41 ^ local_f0;
      uVar42 = uVar22 ^ uVar35;
      uVar29 = (uVar23 ^ uVar42) & uVar27 ^ uVar42 & uVar35;
      uVar20 = uVar23 & uVar17 ^ uVar42 & uVar35;
      uVar12 = uVar12 ^ uVar18;
      local_f0 = local_f0 ^ uVar42;
      uVar43 = uVar22 ^ uVar41 & uVar19 ^ (uVar41 ^ local_d0) & (uVar12 ^ uVar17) ^ uVar29;
      uVar29 = uVar12 & uVar18 ^ local_f0 ^ local_f0 & uVar14 ^ uVar14 ^ uVar29;
      uVar28 = (uVar18 ^ uVar38) & local_d0 ^ uVar17 ^ uVar23 ^ uVar41 & uVar19 ^ uVar20;
      uVar20 = local_f0 & uVar14 ^ uVar34 ^ (uVar42 ^ local_d0) & (uVar18 ^ uVar34) ^ local_f0 ^
               uVar20;
      uVar22 = uVar29 & uVar43;
      uVar43 = uVar43 ^ uVar28;
      uVar24 = (uVar20 ^ uVar22) & uVar43 ^ uVar28;
      uVar28 = (uVar28 ^ uVar22) & (uVar20 ^ uVar29);
      uVar39 = uVar28 ^ uVar20;
      uVar28 = (uVar28 ^ uVar22) & uVar20;
      uVar29 = uVar29 ^ uVar28;
      uVar43 = (uVar28 ^ uVar20 ^ uVar22) & uVar24 ^ uVar43;
      uVar47 = uVar29 ^ uVar39;
      uVar20 = uVar43 ^ uVar47;
      uVar48 = uVar47 & (uVar12 ^ uVar17);
      uVar30 = uVar24 ^ uVar39;
      local_f0 = local_f0 & (uVar43 ^ uVar24);
      uVar14 = (uVar43 ^ uVar24) & uVar14;
      uVar50 = (uVar42 ^ local_d0) & uVar24;
      uVar22 = (uVar23 ^ uVar42) & (uVar20 ^ uVar30);
      uVar27 = (uVar20 ^ uVar30) & uVar27;
      uVar45 = uVar43 & uVar12 ^ uVar50;
      uVar28 = uVar41 & uVar29 ^ local_f0;
      uVar32 = uVar42 & uVar30 ^ local_f0 ^ uVar22;
      uVar52 = uVar14 ^ local_d0 & uVar39 ^ uVar28;
      uVar42 = uVar30 & uVar35 ^ uVar27;
      uVar30 = uVar52 ^ uVar45 ^ uVar42;
      uVar42 = uVar42 ^ uVar18 & uVar43;
      uVar12 = uVar23 & uVar20 ^ uVar22 ^ uVar42;
      uVar42 = uVar42 ^ uVar48 ^ uVar29 & uVar19;
      uVar19 = uVar18 & uVar43 ^ uVar32;
      uVar22 = (uVar41 ^ local_d0) & uVar47 ^ uVar42;
      uVar42 = uVar42 ^ uVar32;
      uVar34 = uVar24 & (uVar18 ^ uVar34) ^ uVar52 ^ uVar12;
      uVar12 = uVar12 ^ uVar14 ^ uVar45;
      uVar28 = uVar28 ^ uVar22;
      uVar22 = uVar22 ^ uVar50 ^ local_d0 & uVar39;
      uVar38 = uVar39 & (uVar18 ^ uVar38) ^ uVar48 ^ uVar34;
      uVar41 = uVar28 ^ uVar19;
      uVar34 = uVar20 & uVar17 ^ uVar27 ^ uVar19 ^ uVar34;
      uVar30 = ((uVar30 >> 8 ^ uVar30) & 0xcc00cc00cc00cc) * 0x101 ^ uVar30;
      uVar12 = ((uVar12 >> 8 ^ uVar12) & 0xcc00cc00cc00cc) * 0x101 ^ uVar12;
      uVar38 = ((uVar38 >> 8 ^ uVar38) & 0xcc00cc00cc00cc) * 0x101 ^ uVar38;
      uVar22 = ((uVar22 >> 8 ^ uVar22) & 0xcc00cc00cc00cc) * 0x101 ^ uVar22;
      uVar28 = ((uVar28 >> 8 ^ uVar28) & 0xcc00cc00cc00cc) * 0x101 ^ uVar28;
      uVar34 = ((uVar34 >> 8 ^ uVar34) & 0xcc00cc00cc00cc) * 0x101 ^ uVar34;
      uVar41 = ((uVar41 >> 8 ^ uVar41) & 0xcc00cc00cc00cc) * 0x101 ^ uVar41;
      uVar42 = ((uVar42 >> 8 ^ uVar42) & 0xcc00cc00cc00cc) * 0x101 ^ uVar42;
      psVar25 = local_80->vt;
      psVar4 = ciph[uVar13 * 8 + -0x99].vt;
      psVar5 = ciph[uVar13 * 8 + -0x98].vt;
      psVar6 = ciph[uVar13 * 8 + -0x97].vt;
      psVar7 = ciph[uVar13 * 8 + -0x96].vt;
      psVar8 = ciph[uVar13 * 8 + -0x95].vt;
      psVar9 = ciph[uVar13 * 8 + -0x94].vt;
      psVar10 = ciph[uVar13 * 8 + -0x93].vt;
      for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
        bVar15 = (byte)lVar16;
        uVar27 = ((uVar12 & 0x5555555555555555 | (uVar12 & 0xa000a000a000a) << 0xc |
                  uVar12 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar4) >> (bVar15 & 0x3f) & 0xffff |
                 (ulong)(uint)((int)(((uVar22 & 0x5555555555555555 |
                                       (uVar22 & 0xa000a000a000a) << 0xc |
                                      uVar22 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar6) >>
                                    (bVar15 & 0x3f)) << 0x10) |
                 (((uVar34 & 0x5555555555555555 | (uVar34 & 0xa000a000a000a) << 0xc |
                   uVar34 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar8) >> (bVar15 & 0x3f) & 0xffff) <<
                 0x20 | (((uVar42 & 0x5555555555555555 | (uVar42 & 0xa000a000a000a) << 0xc |
                          uVar42 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar10) >> (bVar15 & 0x3f)) <<
                        0x30;
        uVar13 = ((uVar30 & 0x5555555555555555 | (uVar30 & 0xa000a000a000a) << 0xc |
                  uVar30 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar25) >> (bVar15 & 0x3f) & 0xffff |
                 (ulong)(uint)((int)(((uVar38 & 0x5555555555555555 |
                                       (uVar38 & 0xa000a000a000a) << 0xc |
                                      uVar38 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar5) >>
                                    (bVar15 & 0x3f)) << 0x10) |
                 (((uVar28 & 0x5555555555555555 | (uVar28 & 0xa000a000a000a) << 0xc |
                   uVar28 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar7) >> (bVar15 & 0x3f) & 0xffff) <<
                 0x20 | (((uVar41 & 0x5555555555555555 | (uVar41 & 0xa000a000a000a) << 0xc |
                          uVar41 >> 4 & 0xaaa0aaa0aaa0aaa) ^ (ulong)psVar9) >> (bVar15 & 0x3f)) <<
                        0x30;
        uVar14 = (uVar13 >> 8 ^ uVar27) & 0xff00ff00ff00ff;
        uVar13 = uVar14 << 8 ^ uVar13;
        uVar14 = uVar14 ^ uVar27;
        uVar13 = (ulong)(((uint)(uVar13 >> 0x1c) ^ (uint)uVar13) & 0xf0f0f0f0) * 0x10000001 ^ uVar13
        ;
        uVar14 = (ulong)(((uint)(uVar14 >> 0x1c) ^ (uint)uVar14) & 0xf0f0f0f0) * 0x10000001 ^ uVar14
        ;
        uVar13 = ((uVar13 >> 0xe ^ uVar13) & 0xcccc0000cccc) * 0x4001 ^ uVar13;
        uVar14 = ((uVar14 >> 0xe ^ uVar14) & 0xcccc0000cccc) * 0x4001 ^ uVar14;
        vp = (void *)((long)&psVar1->new + lVar16);
        PUT_64BIT_LSB_FIRST(vp,((uVar13 >> 7 ^ uVar13) & 0xaa00aa00aa00aa) * 0x81 ^ uVar13);
        PUT_64BIT_LSB_FIRST((void *)((long)vp + 8),
                            ((uVar14 >> 7 ^ uVar14) & 0xaa00aa00aa00aa) * 0x81 ^ uVar14);
      }
      psVar2->vt = psVar1;
      psVar25 = psVar1;
    }
    memxor16(vblk,vblk,psVar25);
    psVar2->vt = (ssh_cipheralg *)&psVar2->vt->setiv;
  }
  return;
}

Assistant:

static inline void aes_sdctr_sw(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * SDCTR encrypt/decrypt loops round one block at a time XORing
     * the keystream into the user's data, and periodically has to run
     * a parallel encryption operation to get more keystream.
     */

    uint8_t *keystream_end =
        ctx->iv.sdctr.keystream + sizeof(ctx->iv.sdctr.keystream);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {

        if (ctx->iv.sdctr.keystream_pos == keystream_end) {
            /*
             * Generate some keystream.
             */
            for (uint8_t *block = ctx->iv.sdctr.keystream;
                 block < keystream_end; block += 16) {
                /* Format the counter value into the buffer. */
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    PUT_BIGNUMINT_MSB_FIRST(
                        block + 16 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES,
                        ctx->iv.sdctr.counter[i]);

                /* Increment the counter. */
                BignumCarry carry = 1;
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    BignumADC(ctx->iv.sdctr.counter[i], carry,
                              ctx->iv.sdctr.counter[i], 0, carry);
            }

            /* Encrypt all those counter blocks. */
            aes_sliced_e_parallel(ctx->iv.sdctr.keystream,
                                  ctx->iv.sdctr.keystream, &ctx->sk);

            /* Reset keystream_pos to the start of the buffer. */
            ctx->iv.sdctr.keystream_pos = ctx->iv.sdctr.keystream;
        }

        memxor16(blk, blk, ctx->iv.sdctr.keystream_pos);
        ctx->iv.sdctr.keystream_pos += 16;
    }
}